

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_isResolvedUnitsOverTwoLevelsUnresolved_Test::
Importer_isResolvedUnitsOverTwoLevelsUnresolved_Test
          (Importer_isResolvedUnitsOverTwoLevelsUnresolved_Test *this)

{
  Importer_isResolvedUnitsOverTwoLevelsUnresolved_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Importer_isResolvedUnitsOverTwoLevelsUnresolved_Test_001a1c48;
  return;
}

Assistant:

TEST(Importer, isResolvedUnitsOverTwoLevelsUnresolved)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/master_units_unresolved.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(2), importer->libraryCount());
    EXPECT_EQ(resourcePath("importer/units_definition_level_1_unresolved.cellml"), importer->key(0));
    EXPECT_EQ(resourcePath("importer/units_source.cellml"), importer->key(1));

    auto units1 = model->units(0);

    EXPECT_FALSE(units1->isResolved());

    EXPECT_TRUE(model->hasUnresolvedImports());
}